

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelRow_C(uint8 *src_sobelx,uint8 *src_sobely,uint8 *dst_argb,int width)

{
  uint8 uVar1;
  int32 iVar2;
  int s;
  int b;
  int r;
  int i;
  int width_local;
  uint8 *dst_argb_local;
  uint8 *src_sobely_local;
  uint8 *src_sobelx_local;
  
  _i = dst_argb;
  for (b = 0; b < width; b = b + 1) {
    iVar2 = libyuv::clamp255((uint)src_sobelx[b] + (uint)src_sobely[b]);
    uVar1 = (uint8)iVar2;
    *_i = uVar1;
    _i[1] = uVar1;
    _i[2] = uVar1;
    _i[3] = 0xff;
    _i = _i + 4;
  }
  return;
}

Assistant:

void SobelRow_C(const uint8* src_sobelx,
                const uint8* src_sobely,
                uint8* dst_argb,
                int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int s = clamp255(r + b);
    dst_argb[0] = (uint8)(s);
    dst_argb[1] = (uint8)(s);
    dst_argb[2] = (uint8)(s);
    dst_argb[3] = (uint8)(255u);
    dst_argb += 4;
  }
}